

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

int inhishop(monst *mtmp)

{
  boolean bVar1;
  char *pcVar2;
  bool local_11;
  monst *mtmp_local;
  
  pcVar2 = in_rooms(mtmp->dlevel,mtmp->mx,mtmp->my,0x12);
  pcVar2 = strchr(pcVar2,(int)(char)mtmp[0x1b].meating);
  local_11 = false;
  if (pcVar2 != (char *)0x0) {
    bVar1 = on_level((d_level *)&mtmp[0x1b].mxlth,&mtmp->dlevel->z);
    local_11 = bVar1 != '\0';
  }
  return (int)local_11;
}

Assistant:

int inhishop(struct monst *mtmp)
{
	return(strchr(in_rooms(mtmp->dlevel, mtmp->mx, mtmp->my, SHOPBASE),
		     ESHK(mtmp)->shoproom) &&
		on_level(&(ESHK(mtmp)->shoplevel), &mtmp->dlevel->z));
}